

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::GetRawRepeatedField
          (ExtensionSet *this,int number,void *default_value)

{
  Extension *pEVar1;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 != (Extension *)0x0) {
    default_value = (void *)(pEVar1->field_0).int64_t_value;
  }
  return default_value;
}

Assistant:

const void* ExtensionSet::GetRawRepeatedField(int number,
                                              const void* default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    return default_value;
  }
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}